

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeFloatBinary
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  OpCode OVar1;
  GlobOpt *dst;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  uint sourceContextId;
  uint functionId;
  FloatConstantValueInfo *pFVar6;
  Value *pVVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  char16 *pcVar9;
  uint uVar10;
  BasicBlock *block;
  Opnd *opnd;
  char *this_02;
  BailOutKind BVar11;
  
  if ((this->field_0xf5 & 0x20) == 0) {
    return false;
  }
  bVar3 = OpCodeAttr::IsInlineBuiltIn(instr->m_opcode);
  OVar1 = instr->m_opcode;
  if (bVar3) {
    if (OVar1 == InlineArrayPush) {
      bVar3 = ValueInfo::IsFloatConstant(src2Val->valueInfo);
      if (bVar3) {
        pFVar6 = ValueInfo::AsFloatConstant(src2Val->valueInfo);
        bVar3 = (undefined1 *)pFVar6->floatValue == &DAT_fff80002fff80002;
      }
      else {
        bVar3 = false;
      }
      bVar4 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
      if (bVar3) {
        return false;
      }
      if (!bVar4) {
        return false;
      }
      opnd = instr->m_src2;
      block = this->currentBlock;
      BVar11 = BailOutNumberOnly;
LAB_0045f8ae:
      ToTypeSpecUse(this,instr,opnd,block,src2Val,(IndirOpnd *)0x0,TyFloat64,BVar11,false,
                    (Instr *)0x0);
      goto LAB_0045fb3a;
    }
    BVar11 = BailOutPrimitiveButString;
    bVar3 = false;
  }
  else {
    uVar10 = (uint)OVar1;
    if (uVar10 < 0x194) {
      if (0x2c < uVar10) {
        switch(OVar1) {
        case Add_A:
          if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
            return false;
          }
          bVar3 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
          if (!bVar3) {
            return false;
          }
          bVar4 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
          BVar11 = BailOutPrimitiveButString;
          bVar3 = false;
          if (!bVar4) {
            return false;
          }
          goto LAB_0045f92a;
        case Div_A:
        case Mul_A:
        case Sub_A:
        case Expo_A:
          bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
          if (bVar3) {
            return false;
          }
          goto LAB_0045f83f;
        default:
          return false;
        case CmEq_A:
        case CmNeq_A:
        case CmSrEq_A:
        case CmSrNeq_A:
          bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
          if (bVar3) {
            return false;
          }
          bVar3 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
          if (bVar3) {
            return false;
          }
          BVar11 = BailOutNumberOnly;
          break;
        case CmGe_A:
        case CmGt_A:
        case CmLt_A:
        case CmLe_A:
          bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
          if (bVar3) {
            return false;
          }
          bVar3 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
          if (bVar3) {
            return false;
          }
          BVar11 = BailOutPrimitiveButString;
        }
        bVar3 = true;
        goto LAB_0045f92a;
      }
      if (3 < OVar1 - 0x10) {
        if ((1 < OVar1 - 0xc) && (1 < uVar10 - 0x14)) {
          return false;
        }
        goto LAB_0045f7f4;
      }
LAB_0045f825:
      bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
      if (bVar3) {
        return false;
      }
LAB_0045f83f:
      bVar4 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
      BVar11 = BailOutPrimitiveButString;
    }
    else {
      if (3 < OVar1 - 0x194) {
        if (OVar1 - 0x198 < 4) goto LAB_0045f825;
        if (uVar10 != 0x1ee) {
          return false;
        }
        opnd = instr->m_src1;
        block = this->currentBlock;
        BVar11 = BailOutPrimitiveButString;
        src2Val = src1Val;
        goto LAB_0045f8ae;
      }
LAB_0045f7f4:
      bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
      if (bVar3) {
        return false;
      }
      bVar4 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
      BVar11 = BailOutNumberOnly;
    }
    bVar3 = false;
    if (bVar4 != false) {
      return false;
    }
  }
LAB_0045f92a:
  ToTypeSpecUse(this,instr,instr->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,TyFloat64,
                BVar11,false,(Instr *)0x0);
  ToTypeSpecUse(this,instr,instr->m_src2,this->currentBlock,src2Val,(IndirOpnd *)0x0,TyFloat64,
                BVar11,false,(Instr *)0x0);
  dst = (GlobOpt *)instr->m_dst;
  if (dst != (GlobOpt *)0x0) {
    if (bVar3) {
      pVVar7 = CreateDstUntransferredValue(this,(ValueType)0x400,instr,src1Val,src2Val);
      *pDstVal = pVVar7;
      this_02 = (char *)dst;
      OVar5 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        this_02 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_0045fc91:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      ToVarStackSym((GlobOpt *)this_02,(StackSym *)dst->intConstantToStackSymMap,this->currentBlock)
      ;
    }
    else {
      pVVar7 = CreateDstUntransferredValue(this,(ValueType)0x108,instr,src1Val,src2Val);
      *pDstVal = pVVar7;
      OVar5 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2ab7,"(dst->IsRegOpnd())","What else?");
        if (!bVar3) goto LAB_0045fc91;
        *puVar8 = 0;
      }
      OVar5 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_0045fc91;
        *puVar8 = 0;
      }
      ToFloat64Dst(this,instr,(RegOpnd *)dst,this->currentBlock);
    }
  }
LAB_0045fb3a:
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,sourceContextId,functionId);
  if (bVar3) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized to FLOAT: ");
    IR::Instr::Dump(instr);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,FloatTypeSpecPhase);
  if (bVar3) {
    Output::Print(L"Type specialized to FLOAT: ");
    pcVar9 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    Output::Print(L"%s \n",pcVar9);
  }
  return true;
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatBinary(IR::Instr *instr, Value *src1Val, Value *src2Val, Value **pDstVal)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Opnd *dst;
    bool allowUndefinedOrNullSrc1 = true;
    bool allowUndefinedOrNullSrc2 = true;

    bool skipSrc1 = false;
    bool skipSrc2 = false;
    bool skipDst = false;
    bool convertDstToBool = false;

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Expo_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotNeq_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            // Undef == Undef, but +Undef != +Undef
            // 0.0 != null, but 0.0 == +null
            //
            // So Bailout on anything but numbers for both src1 and src2
            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            break;

        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::Add_A:
            // For Add, we need both sources to be Numbers, otherwise it could be a string concat
            if (!src1Val || !src2Val || !(src1Val->GetValueInfo()->IsLikelyNumber() && src2Val->GetValueInfo()->IsLikelyNumber()))
            {
                return false;
            }
            break;

        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipSrc2 = true;
            skipDst = true;
            break;

        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrNeq_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            convertDstToBool = true;
            break;
        }

        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            convertDstToBool = true;
            break;
        }
        
        default:
            return false;
        }
    }
    else
    {
        switch (instr->m_opcode)
        {
            case Js::OpCode::InlineArrayPush:
                bool isFloatConstMissingItem = src2Val->GetValueInfo()->IsFloatConstant();

                if(isFloatConstMissingItem)
                {
                    FloatConstType floatValue = src2Val->GetValueInfo()->AsFloatConstant()->FloatValue();
                    isFloatConstMissingItem = Js::SparseArraySegment<double>::IsMissingItem(&floatValue);
                }
                // Don't specialize if the element is not likelyNumber - we will surely bailout
                if(!(src2Val->GetValueInfo()->IsLikelyNumber()) || isFloatConstMissingItem)
                {
                    return false;
                }
                // Only specialize the Second source - element
                skipSrc1 = true;
                skipDst = true;
                allowUndefinedOrNullSrc2 = false;
                break;
        }
    }

    // Make sure the srcs are specialized
    if(!skipSrc1)
    {
        src1 = instr->GetSrc1();
        this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, (allowUndefinedOrNullSrc1 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipSrc2)
    {
        src2 = instr->GetSrc2();
        this->ToFloat64(instr, src2, this->currentBlock, src2Val, nullptr, (allowUndefinedOrNullSrc2 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            if (convertDstToBool)
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Boolean, instr, src1Val, src2Val);
                ToVarRegOpnd(dst->AsRegOpnd(), currentBlock);
            }
            else
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Val, src2Val);
                AssertMsg(dst->IsRegOpnd(), "What else?");
                this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}